

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::D_formatter<spdlog::details::scoped_padder>::format
          (D_formatter<spdlog::details::scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  size_t sVar1;
  format_string_checker<char,_1,_0,_false> *handler;
  memory_buf_t *handler_00;
  buffer<char> *buf;
  uint uVar2;
  ulong uVar3;
  basic_string_view<char> fmt;
  string_view fmt_00;
  basic_string_view<char> fmt_01;
  string_view fmt_02;
  basic_string_view<char> fmt_03;
  string_view fmt_04;
  format_args args;
  format_args args_00;
  format_args args_01;
  scoped_padder p;
  uint local_88 [2];
  undefined8 local_80;
  undefined4 local_78;
  char *local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined1 *local_58;
  code *local_50;
  scoped_padder local_48;
  
  handler_00 = dest;
  scoped_padder::scoped_padder(&local_48,10,&(this->super_flag_formatter).padinfo_,dest);
  uVar2 = tm_time->tm_mon + 1;
  if (uVar2 < 100) {
    uVar3 = (dest->super_buffer<char>).size_ + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar3) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar3);
    }
    sVar1 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar1 + 1;
    (dest->super_buffer<char>).ptr_[sVar1] = (byte)(uVar2 / 10) | 0x30;
    uVar3 = (dest->super_buffer<char>).size_ + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar3) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar3);
    }
    sVar1 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar1 + 1;
    (dest->super_buffer<char>).ptr_[sVar1] =
         (char)uVar2 + ((char)(uVar2 / 10) + (char)(uVar2 / 10)) * -5 | 0x30;
  }
  else {
    local_88[0] = 1;
    local_80 = 0;
    local_78 = 0;
    local_70 = "{:02}";
    local_68 = 5;
    local_60 = 0x100000000;
    local_50 = ::fmt::v11::detail::invoke_parse<int&,char>;
    fmt.size_ = (size_t)local_88;
    fmt.data_ = (char *)0x5;
    local_58 = (undefined1 *)local_88;
    ::fmt::v11::detail::
    parse_format_string<char,fmt::v11::detail::format_string_checker<char,1,0,false>>
              ((detail *)"{:02}",fmt,(format_string_checker<char,_1,_0,_false> *)handler_00);
    fmt_00.size_ = 5;
    fmt_00.data_ = "{:02}";
    args.field_1.values_ = (value<fmt::v11::context> *)local_88;
    args.desc_ = 1;
    local_88[0] = uVar2;
    ::fmt::v11::detail::vformat_to(&dest->super_buffer<char>,fmt_00,args,(locale_ref)0x0);
  }
  uVar3 = (dest->super_buffer<char>).size_ + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar3) {
    (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar3);
  }
  handler = (format_string_checker<char,_1,_0,_false> *)(dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = (size_t)((long)handler->types_ + 1);
  *(char *)((long)handler->types_ + (long)(dest->super_buffer<char>).ptr_) = '/';
  uVar2 = tm_time->tm_mday;
  if (uVar2 < 100) {
    uVar3 = (dest->super_buffer<char>).size_ + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar3) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar3);
    }
    sVar1 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar1 + 1;
    (dest->super_buffer<char>).ptr_[sVar1] = (byte)(uVar2 / 10) | 0x30;
    uVar3 = (dest->super_buffer<char>).size_ + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar3) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar3);
    }
    sVar1 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar1 + 1;
    (dest->super_buffer<char>).ptr_[sVar1] =
         (char)uVar2 + ((char)(uVar2 / 10) + (char)(uVar2 / 10)) * -5 | 0x30;
  }
  else {
    local_88[0] = 1;
    local_80 = 0;
    local_78 = 0;
    local_70 = "{:02}";
    local_68 = 5;
    local_60 = 0x100000000;
    local_50 = ::fmt::v11::detail::invoke_parse<int&,char>;
    fmt_01.size_ = (size_t)local_88;
    fmt_01.data_ = (char *)0x5;
    local_58 = (undefined1 *)local_88;
    ::fmt::v11::detail::
    parse_format_string<char,fmt::v11::detail::format_string_checker<char,1,0,false>>
              ((detail *)"{:02}",fmt_01,handler);
    fmt_02.size_ = 5;
    fmt_02.data_ = "{:02}";
    args_00.field_1.values_ = (value<fmt::v11::context> *)local_88;
    args_00.desc_ = 1;
    local_88[0] = uVar2;
    ::fmt::v11::detail::vformat_to(&dest->super_buffer<char>,fmt_02,args_00,(locale_ref)0x0);
  }
  uVar3 = (dest->super_buffer<char>).size_ + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar3) {
    (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar3);
  }
  sVar1 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar1 + 1;
  (dest->super_buffer<char>).ptr_[sVar1] = '/';
  uVar2 = tm_time->tm_year % 100;
  if (uVar2 < 100) {
    uVar3 = (dest->super_buffer<char>).size_ + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar3) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar3);
    }
    sVar1 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar1 + 1;
    (dest->super_buffer<char>).ptr_[sVar1] = (byte)(uVar2 / 10) | 0x30;
    uVar3 = (dest->super_buffer<char>).size_ + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar3) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar3);
    }
    sVar1 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar1 + 1;
    (dest->super_buffer<char>).ptr_[sVar1] =
         (char)uVar2 + ((char)(uVar2 / 10) + (char)(uVar2 / 10)) * -5 | 0x30;
  }
  else {
    local_88[0] = 1;
    local_80 = 0;
    local_78 = 0;
    local_70 = "{:02}";
    local_68 = 5;
    local_60 = 0x100000000;
    local_50 = ::fmt::v11::detail::invoke_parse<int&,char>;
    fmt_03.size_ = (size_t)local_88;
    fmt_03.data_ = (char *)0x5;
    local_58 = (undefined1 *)local_88;
    ::fmt::v11::detail::
    parse_format_string<char,fmt::v11::detail::format_string_checker<char,1,0,false>>
              ((detail *)"{:02}",fmt_03,
               (format_string_checker<char,_1,_0,_false> *)((ulong)(long)tm_time->tm_year >> 0x3f));
    fmt_04.size_ = 5;
    fmt_04.data_ = "{:02}";
    args_01.field_1.values_ = (value<fmt::v11::context> *)local_88;
    args_01.desc_ = 1;
    local_88[0] = uVar2;
    ::fmt::v11::detail::vformat_to(&dest->super_buffer<char>,fmt_04,args_01,(locale_ref)0x0);
  }
  scoped_padder::~scoped_padder(&local_48);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override {
        const size_t field_size = 10;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::pad2(tm_time.tm_mon + 1, dest);
        dest.push_back('/');
        fmt_helper::pad2(tm_time.tm_mday, dest);
        dest.push_back('/');
        fmt_helper::pad2(tm_time.tm_year % 100, dest);
    }